

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::LibraryDeclarationSyntax::setChild
          (LibraryDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b91c4 + *(int *)(&DAT_015b91c4 + in_RSI * 4)))();
  return;
}

Assistant:

void LibraryDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: library = child.token(); return;
        case 2: name = child.token(); return;
        case 3: filePaths = child.node()->as<SeparatedSyntaxList<FilePathSpecSyntax>>(); return;
        case 4: incDirClause = child.node() ? &child.node()->as<LibraryIncDirClauseSyntax>() : nullptr; return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}